

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<8>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 (*pauVar53) [16];
  long lVar54;
  long lVar55;
  undefined1 auVar56 [24];
  int iVar57;
  AABBNodeMB4D *node1;
  ulong uVar58;
  uint uVar59;
  ulong uVar60;
  uint uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  Geometry *pGVar65;
  ulong uVar66;
  GridSOA *pGVar67;
  ulong uVar68;
  GridSOA *pGVar69;
  undefined1 (*pauVar70) [16];
  vint4 bi_1;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar85 [32];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  vint4 bi;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  vint4 ai;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  undefined4 uVar112;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined8 uStack_1498;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  GridSOA *local_1438;
  ulong local_1430;
  ulong local_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  Geometry *local_1400;
  undefined1 auStack_13f8 [24];
  GridSOA *local_13d8;
  RTCFilterFunctionNArguments local_13d0;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [16];
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  GridSOA **local_12e0;
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar104 [32];
  
  pauVar70 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar128._4_4_ = fVar1;
  auVar128._0_4_ = fVar1;
  auVar128._8_4_ = fVar1;
  auVar128._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar132._4_4_ = fVar2;
  auVar132._0_4_ = fVar2;
  auVar132._8_4_ = fVar2;
  auVar132._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar134._4_4_ = fVar3;
  auVar134._0_4_ = fVar3;
  auVar134._8_4_ = fVar3;
  auVar134._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar57 = (tray->tfar).field_0.i[k];
  auVar82 = ZEXT1664(CONCAT412(iVar57,CONCAT48(iVar57,CONCAT44(iVar57,iVar57))));
  auVar137._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar137._8_4_ = -fVar1;
  auVar137._12_4_ = -fVar1;
  auVar140._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar140._8_4_ = -fVar2;
  auVar140._12_4_ = -fVar2;
  auVar144._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar144._8_4_ = -fVar3;
  auVar144._12_4_ = -fVar3;
  iVar57 = (tray->tnear).field_0.i[k];
  auVar159._4_4_ = iVar57;
  auVar159._0_4_ = iVar57;
  auVar159._8_4_ = iVar57;
  auVar159._12_4_ = iVar57;
  iVar57 = 1 << ((uint)k & 0x1f);
  auVar85._4_4_ = iVar57;
  auVar85._0_4_ = iVar57;
  auVar85._8_4_ = iVar57;
  auVar85._12_4_ = iVar57;
  auVar85._16_4_ = iVar57;
  auVar85._20_4_ = iVar57;
  auVar85._24_4_ = iVar57;
  auVar85._28_4_ = iVar57;
  auVar71 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar85 = vpand_avx2(auVar85,auVar71);
  local_11e0 = vpcmpeqd_avx2(auVar85,auVar71);
LAB_01619de6:
  do {
    do {
      if (pauVar70 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar53 = pauVar70 + -1;
      pauVar70 = pauVar70 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar53 + 8));
    uVar64 = *(ulong *)*pauVar70;
    while ((uVar64 & 8) == 0) {
      uVar58 = uVar64 & 0xfffffffffffffff0;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar83._4_4_ = uVar112;
      auVar83._0_4_ = uVar112;
      auVar83._8_4_ = uVar112;
      auVar83._12_4_ = uVar112;
      auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + uVar68),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + uVar68));
      auVar84 = vfmadd213ps_fma(auVar84,auVar128,auVar137);
      auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + uVar66),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + uVar66));
      auVar91 = vfmadd213ps_fma(auVar91,auVar132,auVar140);
      auVar84 = vpmaxsd_avx(auVar84,auVar91);
      auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + uVar62),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + uVar62));
      auVar91 = vfmadd213ps_fma(auVar91,auVar134,auVar144);
      auVar91 = vpmaxsd_avx(auVar91,auVar159);
      local_1340 = vpmaxsd_avx(auVar84,auVar91);
      auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + (uVar68 ^ 0x10)),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + (uVar68 ^ 0x10)));
      auVar84 = vfmadd213ps_fma(auVar84,auVar128,auVar137);
      auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + (uVar66 ^ 0x10)),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + (uVar66 ^ 0x10)));
      auVar91 = vfmadd213ps_fma(auVar91,auVar132,auVar140);
      auVar84 = vpminsd_avx(auVar84,auVar91);
      auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar58 + 0x80 + (uVar62 ^ 0x10)),auVar83,
                                *(undefined1 (*) [16])(uVar58 + 0x20 + (uVar62 ^ 0x10)));
      auVar91 = vfmadd213ps_fma(auVar91,auVar134,auVar144);
      auVar91 = vpminsd_avx(auVar91,auVar82._0_16_);
      auVar84 = vpminsd_avx(auVar84,auVar91);
      if (((uint)uVar64 & 7) == 6) {
        auVar91 = vcmpps_avx(local_1340,auVar84,2);
        auVar84 = vcmpps_avx(*(undefined1 (*) [16])(uVar58 + 0xe0),auVar83,2);
        auVar83 = vcmpps_avx(auVar83,*(undefined1 (*) [16])(uVar58 + 0xf0),1);
        auVar84 = vandps_avx(auVar84,auVar83);
        auVar84 = vandps_avx(auVar84,auVar91);
      }
      else {
        auVar84 = vcmpps_avx(local_1340,auVar84,2);
      }
      auVar84 = vpslld_avx(auVar84,0x1f);
      uVar59 = vmovmskps_avx(auVar84);
      if (uVar59 == 0) goto LAB_01619de6;
      uVar59 = uVar59 & 0xff;
      lVar31 = 0;
      for (uVar64 = (ulong)uVar59; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar64 = *(ulong *)(uVar58 + lVar31 * 8);
      uVar59 = uVar59 - 1 & uVar59;
      uVar60 = (ulong)uVar59;
      if (uVar59 != 0) {
        uVar61 = *(uint *)(local_1340 + lVar31 * 4);
        lVar31 = 0;
        for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
          lVar31 = lVar31 + 1;
        }
        uVar59 = uVar59 - 1 & uVar59;
        uVar63 = (ulong)uVar59;
        uVar60 = *(ulong *)(uVar58 + lVar31 * 8);
        uVar13 = *(uint *)(local_1340 + lVar31 * 4);
        if (uVar59 == 0) {
          if (uVar61 < uVar13) {
            *(ulong *)*pauVar70 = uVar60;
            *(uint *)(*pauVar70 + 8) = uVar13;
            pauVar70 = pauVar70 + 1;
          }
          else {
            *(ulong *)*pauVar70 = uVar64;
            *(uint *)(*pauVar70 + 8) = uVar61;
            uVar64 = uVar60;
            pauVar70 = pauVar70 + 1;
          }
        }
        else {
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar64;
          auVar84 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar61));
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar60;
          auVar91 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar13));
          lVar31 = 0;
          for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar59 = uVar59 - 1 & uVar59;
          uVar64 = (ulong)uVar59;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(uVar58 + lVar31 * 8);
          auVar94 = vpunpcklqdq_avx(auVar94,ZEXT416(*(uint *)(local_1340 + lVar31 * 4)));
          auVar83 = vpcmpgtd_avx(auVar91,auVar84);
          if (uVar59 == 0) {
            auVar102 = vpshufd_avx(auVar83,0xaa);
            auVar83 = vblendvps_avx(auVar91,auVar84,auVar102);
            auVar84 = vblendvps_avx(auVar84,auVar91,auVar102);
            auVar91 = vpcmpgtd_avx(auVar94,auVar83);
            auVar102 = vpshufd_avx(auVar91,0xaa);
            auVar91 = vblendvps_avx(auVar94,auVar83,auVar102);
            auVar83 = vblendvps_avx(auVar83,auVar94,auVar102);
            auVar94 = vpcmpgtd_avx(auVar83,auVar84);
            auVar102 = vpshufd_avx(auVar94,0xaa);
            auVar94 = vblendvps_avx(auVar83,auVar84,auVar102);
            auVar84 = vblendvps_avx(auVar84,auVar83,auVar102);
            *pauVar70 = auVar84;
            pauVar70[1] = auVar94;
            uVar64 = auVar91._0_8_;
            pauVar70 = pauVar70 + 2;
          }
          else {
            lVar31 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
              lVar31 = lVar31 + 1;
            }
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)(uVar58 + lVar31 * 8);
            auVar103 = vpunpcklqdq_avx(auVar102,ZEXT416(*(uint *)(local_1340 + lVar31 * 4)));
            auVar102 = vpshufd_avx(auVar83,0xaa);
            auVar83 = vblendvps_avx(auVar91,auVar84,auVar102);
            auVar84 = vblendvps_avx(auVar84,auVar91,auVar102);
            auVar91 = vpcmpgtd_avx(auVar103,auVar94);
            auVar102 = vpshufd_avx(auVar91,0xaa);
            auVar91 = vblendvps_avx(auVar103,auVar94,auVar102);
            auVar94 = vblendvps_avx(auVar94,auVar103,auVar102);
            auVar102 = vpcmpgtd_avx(auVar94,auVar84);
            auVar103 = vpshufd_avx(auVar102,0xaa);
            auVar102 = vblendvps_avx(auVar94,auVar84,auVar103);
            auVar84 = vblendvps_avx(auVar84,auVar94,auVar103);
            auVar94 = vpcmpgtd_avx(auVar91,auVar83);
            auVar103 = vpshufd_avx(auVar94,0xaa);
            auVar94 = vblendvps_avx(auVar91,auVar83,auVar103);
            auVar91 = vblendvps_avx(auVar83,auVar91,auVar103);
            auVar83 = vpcmpgtd_avx(auVar102,auVar91);
            auVar103 = vpshufd_avx(auVar83,0xaa);
            auVar83 = vblendvps_avx(auVar102,auVar91,auVar103);
            auVar91 = vblendvps_avx(auVar91,auVar102,auVar103);
            *pauVar70 = auVar84;
            pauVar70[1] = auVar91;
            pauVar70[2] = auVar83;
            uVar64 = auVar94._0_8_;
            pauVar70 = pauVar70 + 3;
          }
        }
      }
    }
    if (((uint)uVar64 & 0xf) == 8) {
      local_13d8 = (pre->super_Precalculations).grid;
      fVar1 = (float)(*(int *)(local_13d8 + 8) - 1) * *(float *)(ray + k * 4 + 0xe0);
      uVar59 = *(uint *)(local_13d8 + 0xc);
      local_1430 = (ulong)uVar59;
      auVar84 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar84 = vminss_avx(auVar84,ZEXT416((uint)((float)(*(int *)(local_13d8 + 8) - 1) + -1.0)));
      auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
      uVar61 = *(uint *)(local_13d8 + 0x10);
      local_1428 = (ulong)uVar61;
      lVar31 = (long)(int)auVar83._0_4_ * (ulong)*(uint *)(local_13d8 + 0x28) +
               (ulong)*(uint *)(local_13d8 + 0x24);
      uVar64 = uVar64 >> 4;
      lVar54 = uVar64 * 4 + lVar31;
      lVar55 = uVar64 * 4 + lVar31 + 0x2c;
      auVar84 = *(undefined1 (*) [16])(local_13d8 + local_1430 * 4 + lVar54 + 0x2c);
      auVar91 = auVar84;
      if (2 < local_1428) {
        auVar91 = *(undefined1 (*) [16])(local_13d8 + local_1430 * 8 + lVar55);
      }
      auVar94 = *(undefined1 (*) [16])(local_13d8 + uVar64 * 4 + lVar31 + 0x2c);
      if (local_1430 == 2) {
        auVar94 = vshufps_avx(auVar94,auVar94,0x54);
        auVar84 = vshufps_avx(auVar84,auVar84,0x54);
        auVar91 = vshufps_avx(auVar91,auVar91,0x54);
      }
      uVar64 = (ulong)*(uint *)(local_13d8 + 0x14);
      pGVar67 = local_13d8 + uVar64 * 4 + lVar54 + 0x2c;
      auVar102 = *(undefined1 (*) [16])(pGVar67 + local_1430 * 4);
      auVar103 = auVar102;
      if (2 < uVar61) {
        auVar103 = *(undefined1 (*) [16])(pGVar67 + local_1430 * 8);
      }
      _local_1540 = *(undefined1 (*) [16])pGVar67;
      if (uVar59 == 2) {
        _local_1540 = vshufps_avx(_local_1540,_local_1540,0x54);
        auVar102 = vshufps_avx(auVar102,auVar102,0x54);
        auVar103 = vshufps_avx(auVar103,auVar103,0x54);
      }
      pGVar69 = local_13d8 + uVar64 * 8 + lVar54 + 0x2c;
      auVar7 = *(undefined1 (*) [16])(pGVar69 + local_1430 * 4);
      auVar113 = auVar7;
      if (2 < uVar61) {
        auVar113 = *(undefined1 (*) [16])(pGVar69 + local_1430 * 8);
      }
      auVar8 = *(undefined1 (*) [16])pGVar69;
      if (uVar59 == 2) {
        auVar8 = vshufps_avx(auVar8,auVar8,0x54);
        auVar7 = vshufps_avx(auVar7,auVar7,0x54);
        auVar113 = vshufps_avx(auVar113,auVar113,0x54);
      }
      uVar58 = (ulong)(*(uint *)(local_13d8 + 0x28) & 0xfffffffc);
      auVar9 = *(undefined1 (*) [16])(local_13d8 + local_1430 * 4 + uVar58 + lVar55);
      auVar114 = auVar9;
      if (2 < uVar61) {
        auVar114 = *(undefined1 (*) [16])(local_13d8 + local_1430 * 8 + uVar58 + lVar55);
      }
      auVar10 = *(undefined1 (*) [16])(local_13d8 + uVar58 + lVar55);
      if (uVar59 == 2) {
        auVar10 = vshufps_avx(auVar10,auVar10,0x54);
        auVar9 = vshufps_avx(auVar9,auVar9,0x54);
        auVar114 = vshufps_avx(auVar114,auVar114,0x54);
      }
      pGVar67 = pGVar67 + uVar58;
      auVar11 = *(undefined1 (*) [16])(pGVar67 + local_1430 * 4);
      auVar160 = auVar11;
      if (2 < uVar61) {
        auVar160 = *(undefined1 (*) [16])(pGVar67 + local_1430 * 8);
      }
      local_13a0._0_16_ = *(undefined1 (*) [16])pGVar67;
      if (uVar59 == 2) {
        local_13a0._0_16_ = vshufps_avx(local_13a0._0_16_,local_13a0._0_16_,0x54);
        auVar11 = vshufps_avx(auVar11,auVar11,0x54);
        auVar160 = vshufps_avx(auVar160,auVar160,0x54);
      }
      pGVar69 = pGVar69 + uVar58;
      auVar124 = *(undefined1 (*) [16])pGVar69;
      auVar12 = *(undefined1 (*) [16])(pGVar69 + local_1430 * 4);
      auVar129 = auVar12;
      if (2 < uVar61) {
        auVar129 = *(undefined1 (*) [16])(pGVar69 + local_1430 * 8);
      }
      fVar1 = fVar1 - auVar83._0_4_;
      auVar71._16_16_ = auVar84;
      auVar71._0_16_ = auVar94;
      auVar78._16_16_ = auVar91;
      auVar78._0_16_ = auVar84;
      auVar26 = vunpcklps_avx(auVar71,auVar78);
      auVar85 = vshufps_avx(auVar71,auVar71,0xa5);
      auVar71 = vshufps_avx(auVar78,auVar78,0x94);
      auVar110._16_16_ = auVar102;
      auVar110._0_16_ = _local_1540;
      auVar138._16_16_ = auVar103;
      auVar138._0_16_ = auVar102;
      auVar27 = vunpcklps_avx(auVar110,auVar138);
      auVar78 = vshufps_avx(auVar110,auVar110,0xa5);
      auVar110 = vshufps_avx(auVar138,auVar138,0x94);
      auVar86._16_16_ = auVar7;
      auVar86._0_16_ = auVar8;
      auVar108._16_16_ = auVar113;
      auVar108._0_16_ = auVar7;
      auVar28 = vunpcklps_avx(auVar86,auVar108);
      auVar86 = vshufps_avx(auVar86,auVar86,0xa5);
      auVar108 = vshufps_avx(auVar108,auVar108,0x94);
      auVar72._16_16_ = auVar9;
      auVar72._0_16_ = auVar10;
      auVar104._16_16_ = auVar114;
      auVar104._0_16_ = auVar9;
      auVar29 = vunpcklps_avx(auVar72,auVar104);
      auVar72 = vshufps_avx(auVar72,auVar72,0xa5);
      auVar104 = vshufps_avx(auVar104,auVar104,0x94);
      auVar116._16_16_ = auVar11;
      auVar116._0_16_ = local_13a0._0_16_;
      auVar145._16_16_ = auVar160;
      auVar145._0_16_ = auVar11;
      auVar30 = vunpcklps_avx(auVar116,auVar145);
      auVar116 = vshufps_avx(auVar116,auVar116,0xa5);
      auVar138 = vshufps_avx(auVar145,auVar145,0x94);
      if (uVar59 == 2) {
        auVar124 = vshufps_avx(auVar124,auVar124,0x54);
        auVar12 = vshufps_avx(auVar12,auVar12,0x54);
        auVar129 = vshufps_avx(auVar129,auVar129,0x54);
      }
      auVar146._16_16_ = auVar12;
      auVar146._0_16_ = auVar124;
      auVar133._16_16_ = auVar129;
      auVar133._0_16_ = auVar12;
      fVar2 = 1.0 - fVar1;
      auVar130._4_4_ = fVar2;
      auVar130._0_4_ = fVar2;
      auVar130._8_4_ = fVar2;
      auVar130._12_4_ = fVar2;
      auVar130._16_4_ = fVar2;
      auVar130._20_4_ = fVar2;
      auVar130._24_4_ = fVar2;
      auVar130._28_4_ = fVar2;
      auVar32._4_4_ = fVar1 * auVar29._4_4_;
      auVar32._0_4_ = fVar1 * auVar29._0_4_;
      auVar32._8_4_ = fVar1 * auVar29._8_4_;
      auVar32._12_4_ = fVar1 * auVar29._12_4_;
      auVar32._16_4_ = fVar1 * auVar29._16_4_;
      auVar32._20_4_ = fVar1 * auVar29._20_4_;
      auVar32._24_4_ = fVar1 * auVar29._24_4_;
      auVar32._28_4_ = auVar29._28_4_;
      auVar84 = vfmadd213ps_fma(auVar26,auVar130,auVar32);
      auVar26._4_4_ = fVar1 * auVar30._4_4_;
      auVar26._0_4_ = fVar1 * auVar30._0_4_;
      auVar26._8_4_ = fVar1 * auVar30._8_4_;
      auVar26._12_4_ = fVar1 * auVar30._12_4_;
      auVar26._16_4_ = fVar1 * auVar30._16_4_;
      auVar26._20_4_ = fVar1 * auVar30._20_4_;
      auVar26._24_4_ = fVar1 * auVar30._24_4_;
      auVar26._28_4_ = auVar29._28_4_;
      auVar91 = vfmadd213ps_fma(auVar27,auVar130,auVar26);
      auVar26 = vunpcklps_avx(auVar146,auVar133);
      auVar27._4_4_ = fVar1 * auVar26._4_4_;
      auVar27._0_4_ = fVar1 * auVar26._0_4_;
      auVar27._8_4_ = fVar1 * auVar26._8_4_;
      auVar27._12_4_ = fVar1 * auVar26._12_4_;
      auVar27._16_4_ = fVar1 * auVar26._16_4_;
      auVar27._20_4_ = fVar1 * auVar26._20_4_;
      auVar27._24_4_ = fVar1 * auVar26._24_4_;
      auVar27._28_4_ = auVar26._28_4_;
      auVar83 = vfmadd213ps_fma(auVar28,auVar130,auVar27);
      auVar28._4_4_ = fVar1 * auVar72._4_4_;
      auVar28._0_4_ = fVar1 * auVar72._0_4_;
      auVar28._8_4_ = fVar1 * auVar72._8_4_;
      auVar28._12_4_ = fVar1 * auVar72._12_4_;
      auVar28._16_4_ = fVar1 * auVar72._16_4_;
      auVar28._20_4_ = fVar1 * auVar72._20_4_;
      auVar28._24_4_ = fVar1 * auVar72._24_4_;
      auVar28._28_4_ = auVar72._28_4_;
      auVar94 = vfmadd213ps_fma(auVar85,auVar130,auVar28);
      local_1438 = local_13d8 + uVar64 * 0xc + lVar54 + 0x2c;
      auVar85 = vshufps_avx(auVar146,auVar146,0xa5);
      auVar72 = vshufps_avx(auVar133,auVar133,0x94);
      local_1420._0_4_ = auVar116._0_4_;
      local_1420._4_4_ = auVar116._4_4_;
      uStack_1418._0_4_ = auVar116._8_4_;
      uStack_1418._4_4_ = auVar116._12_4_;
      uStack_1410._0_4_ = auVar116._16_4_;
      uStack_1410._4_4_ = auVar116._20_4_;
      uStack_1408._0_4_ = auVar116._24_4_;
      auVar29._4_4_ = fVar1 * local_1420._4_4_;
      auVar29._0_4_ = fVar1 * (float)local_1420;
      auVar29._8_4_ = fVar1 * (float)uStack_1418;
      auVar29._12_4_ = fVar1 * uStack_1418._4_4_;
      auVar29._16_4_ = fVar1 * (float)uStack_1410;
      auVar29._20_4_ = fVar1 * uStack_1410._4_4_;
      auVar29._24_4_ = fVar1 * (float)uStack_1408;
      auVar29._28_4_ = auVar129._12_4_;
      auVar30._4_4_ = fVar1 * auVar85._4_4_;
      auVar30._0_4_ = fVar1 * auVar85._0_4_;
      auVar30._8_4_ = fVar1 * auVar85._8_4_;
      auVar30._12_4_ = fVar1 * auVar85._12_4_;
      auVar30._16_4_ = fVar1 * auVar85._16_4_;
      auVar30._20_4_ = fVar1 * auVar85._20_4_;
      auVar30._24_4_ = fVar1 * auVar85._24_4_;
      auVar30._28_4_ = auVar85._28_4_;
      auVar102 = vfmadd213ps_fma(auVar78,auVar130,auVar29);
      auVar103 = vfmadd213ps_fma(auVar86,auVar130,auVar30);
      local_1540._0_4_ = auVar104._0_4_;
      local_1540._4_4_ = auVar104._4_4_;
      fStack_1538 = auVar104._8_4_;
      fStack_1534 = auVar104._12_4_;
      fStack_1530 = auVar104._16_4_;
      fStack_152c = auVar104._20_4_;
      fStack_1528 = auVar104._24_4_;
      auVar33._4_4_ = fVar1 * (float)local_1540._4_4_;
      auVar33._0_4_ = fVar1 * (float)local_1540._0_4_;
      auVar33._8_4_ = fVar1 * fStack_1538;
      auVar33._12_4_ = fVar1 * fStack_1534;
      auVar33._16_4_ = fVar1 * fStack_1530;
      auVar33._20_4_ = fVar1 * fStack_152c;
      auVar33._24_4_ = fVar1 * fStack_1528;
      auVar33._28_4_ = auVar85._28_4_;
      local_1460._0_4_ = auVar138._0_4_;
      local_1460._4_4_ = auVar138._4_4_;
      uStack_1458._0_4_ = auVar138._8_4_;
      uStack_1458._4_4_ = auVar138._12_4_;
      uStack_1450._0_4_ = auVar138._16_4_;
      uStack_1450._4_4_ = auVar138._20_4_;
      uStack_1448._0_4_ = auVar138._24_4_;
      auVar34._4_4_ = fVar1 * local_1460._4_4_;
      auVar34._0_4_ = fVar1 * (float)local_1460;
      auVar34._8_4_ = fVar1 * (float)uStack_1458;
      auVar34._12_4_ = fVar1 * uStack_1458._4_4_;
      auVar34._16_4_ = fVar1 * (float)uStack_1450;
      auVar34._20_4_ = fVar1 * uStack_1450._4_4_;
      auVar34._24_4_ = fVar1 * (float)uStack_1448;
      auVar34._28_4_ = auVar129._12_4_;
      auVar35._4_4_ = fVar1 * auVar72._4_4_;
      auVar35._0_4_ = fVar1 * auVar72._0_4_;
      auVar35._8_4_ = fVar1 * auVar72._8_4_;
      auVar35._12_4_ = fVar1 * auVar72._12_4_;
      auVar35._16_4_ = fVar1 * auVar72._16_4_;
      auVar35._20_4_ = fVar1 * auVar72._20_4_;
      auVar35._24_4_ = fVar1 * auVar72._24_4_;
      auVar35._28_4_ = auVar72._28_4_;
      auVar7 = vfmadd213ps_fma(auVar71,auVar130,auVar33);
      auVar113 = vfmadd213ps_fma(auVar110,auVar130,auVar34);
      auVar8 = vfmadd213ps_fma(auVar108,auVar130,auVar35);
      uVar112 = *(undefined4 *)(ray + k * 4);
      auVar73._4_4_ = uVar112;
      auVar73._0_4_ = uVar112;
      auVar73._8_4_ = uVar112;
      auVar73._12_4_ = uVar112;
      auVar73._16_4_ = uVar112;
      auVar73._20_4_ = uVar112;
      auVar73._24_4_ = uVar112;
      auVar73._28_4_ = uVar112;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar131._4_4_ = uVar112;
      auVar131._0_4_ = uVar112;
      auVar131._8_4_ = uVar112;
      auVar131._12_4_ = uVar112;
      auVar131._16_4_ = uVar112;
      auVar131._20_4_ = uVar112;
      auVar131._24_4_ = uVar112;
      auVar131._28_4_ = uVar112;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar135._4_4_ = uVar112;
      auVar135._0_4_ = uVar112;
      auVar135._8_4_ = uVar112;
      auVar135._12_4_ = uVar112;
      auVar135._16_4_ = uVar112;
      auVar135._20_4_ = uVar112;
      auVar135._24_4_ = uVar112;
      auVar135._28_4_ = uVar112;
      auVar110 = vsubps_avx(ZEXT1632(auVar84),auVar73);
      auVar86 = vsubps_avx(ZEXT1632(auVar91),auVar131);
      local_13a0 = vsubps_avx(ZEXT1632(auVar83),auVar135);
      auVar85 = vsubps_avx(ZEXT1632(auVar94),auVar73);
      auVar71 = vsubps_avx(ZEXT1632(auVar102),auVar131);
      auVar78 = vsubps_avx(ZEXT1632(auVar103),auVar135);
      auVar108 = vsubps_avx(ZEXT1632(auVar7),auVar73);
      auVar72 = vsubps_avx(ZEXT1632(auVar113),auVar131);
      auVar104 = vsubps_avx(ZEXT1632(auVar8),auVar135);
      local_10e0 = vsubps_avx(auVar108,auVar110);
      local_1140 = vsubps_avx(auVar72,auVar86);
      local_1100 = vsubps_avx(auVar104,local_13a0);
      auVar87._0_4_ = auVar110._0_4_ + auVar108._0_4_;
      auVar87._4_4_ = auVar110._4_4_ + auVar108._4_4_;
      auVar87._8_4_ = auVar110._8_4_ + auVar108._8_4_;
      auVar87._12_4_ = auVar110._12_4_ + auVar108._12_4_;
      auVar87._16_4_ = auVar110._16_4_ + auVar108._16_4_;
      auVar87._20_4_ = auVar110._20_4_ + auVar108._20_4_;
      auVar87._24_4_ = auVar110._24_4_ + auVar108._24_4_;
      auVar87._28_4_ = auVar110._28_4_ + auVar108._28_4_;
      auVar100._0_4_ = auVar72._0_4_ + auVar86._0_4_;
      auVar100._4_4_ = auVar72._4_4_ + auVar86._4_4_;
      auVar100._8_4_ = auVar72._8_4_ + auVar86._8_4_;
      auVar100._12_4_ = auVar72._12_4_ + auVar86._12_4_;
      auVar100._16_4_ = auVar72._16_4_ + auVar86._16_4_;
      auVar100._20_4_ = auVar72._20_4_ + auVar86._20_4_;
      auVar100._24_4_ = auVar72._24_4_ + auVar86._24_4_;
      fVar1 = auVar86._28_4_;
      fVar111 = auVar72._28_4_;
      auVar100._28_4_ = fVar111 + fVar1;
      fVar142 = local_13a0._0_4_;
      auVar136._0_4_ = fVar142 + auVar104._0_4_;
      fVar147 = local_13a0._4_4_;
      auVar136._4_4_ = fVar147 + auVar104._4_4_;
      fVar149 = local_13a0._8_4_;
      auVar136._8_4_ = fVar149 + auVar104._8_4_;
      fVar151 = local_13a0._12_4_;
      auVar136._12_4_ = fVar151 + auVar104._12_4_;
      fVar153 = local_13a0._16_4_;
      auVar136._16_4_ = fVar153 + auVar104._16_4_;
      fVar155 = local_13a0._20_4_;
      auVar136._20_4_ = fVar155 + auVar104._20_4_;
      fVar157 = local_13a0._24_4_;
      auVar136._24_4_ = fVar157 + auVar104._24_4_;
      auVar136._28_4_ = local_13a0._28_4_ + auVar104._28_4_;
      auVar141._0_4_ = local_1100._0_4_ * auVar100._0_4_;
      auVar141._4_4_ = local_1100._4_4_ * auVar100._4_4_;
      auVar141._8_4_ = local_1100._8_4_ * auVar100._8_4_;
      auVar141._12_4_ = local_1100._12_4_ * auVar100._12_4_;
      auVar141._16_4_ = local_1100._16_4_ * auVar100._16_4_;
      auVar141._20_4_ = local_1100._20_4_ * auVar100._20_4_;
      auVar141._24_4_ = local_1100._24_4_ * auVar100._24_4_;
      auVar141._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar141,local_1140,auVar136);
      auVar139._0_4_ = auVar136._0_4_ * local_10e0._0_4_;
      auVar139._4_4_ = auVar136._4_4_ * local_10e0._4_4_;
      auVar139._8_4_ = auVar136._8_4_ * local_10e0._8_4_;
      auVar139._12_4_ = auVar136._12_4_ * local_10e0._12_4_;
      auVar139._16_4_ = auVar136._16_4_ * local_10e0._16_4_;
      auVar139._20_4_ = auVar136._20_4_ * local_10e0._20_4_;
      auVar139._24_4_ = auVar136._24_4_ * local_10e0._24_4_;
      auVar139._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar139,local_1100,auVar87);
      auVar36._4_4_ = auVar87._4_4_ * local_1140._4_4_;
      auVar36._0_4_ = auVar87._0_4_ * local_1140._0_4_;
      auVar36._8_4_ = auVar87._8_4_ * local_1140._8_4_;
      auVar36._12_4_ = auVar87._12_4_ * local_1140._12_4_;
      auVar36._16_4_ = auVar87._16_4_ * local_1140._16_4_;
      auVar36._20_4_ = auVar87._20_4_ * local_1140._20_4_;
      auVar36._24_4_ = auVar87._24_4_ * local_1140._24_4_;
      auVar36._28_4_ = auVar87._28_4_;
      local_1120 = *(float *)(ray + k * 4 + 0xc0);
      auVar83 = vfmsub231ps_fma(auVar36,local_10e0,auVar100);
      auVar37._4_4_ = local_1120 * auVar83._4_4_;
      auVar37._0_4_ = local_1120 * auVar83._0_4_;
      auVar37._8_4_ = local_1120 * auVar83._8_4_;
      auVar37._12_4_ = local_1120 * auVar83._12_4_;
      auVar37._16_4_ = local_1120 * 0.0;
      auVar37._20_4_ = local_1120 * 0.0;
      auVar37._24_4_ = local_1120 * 0.0;
      auVar37._28_4_ = local_10e0._28_4_;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0xa0);
      local_1160._4_4_ = uVar112;
      local_1160._0_4_ = uVar112;
      local_1160._8_4_ = uVar112;
      local_1160._12_4_ = uVar112;
      local_1160._16_4_ = uVar112;
      local_1160._20_4_ = uVar112;
      local_1160._24_4_ = uVar112;
      local_1160._28_4_ = uVar112;
      auVar84 = vfmadd231ps_fma(auVar37,local_1160,ZEXT1632(auVar84));
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar74._4_4_ = uVar112;
      auVar74._0_4_ = uVar112;
      auVar74._8_4_ = uVar112;
      auVar74._12_4_ = uVar112;
      auVar74._16_4_ = uVar112;
      auVar74._20_4_ = uVar112;
      auVar74._24_4_ = uVar112;
      auVar74._28_4_ = uVar112;
      local_1340 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar74,ZEXT1632(auVar91));
      local_1180 = vsubps_avx(auVar86,auVar71);
      local_11a0 = vsubps_avx(local_13a0,auVar78);
      auVar92._0_4_ = auVar71._0_4_ + auVar86._0_4_;
      auVar92._4_4_ = auVar71._4_4_ + auVar86._4_4_;
      auVar92._8_4_ = auVar71._8_4_ + auVar86._8_4_;
      auVar92._12_4_ = auVar71._12_4_ + auVar86._12_4_;
      auVar92._16_4_ = auVar71._16_4_ + auVar86._16_4_;
      auVar92._20_4_ = auVar71._20_4_ + auVar86._20_4_;
      auVar92._24_4_ = auVar71._24_4_ + auVar86._24_4_;
      auVar92._28_4_ = auVar71._28_4_ + fVar1;
      auVar101._0_4_ = fVar142 + auVar78._0_4_;
      auVar101._4_4_ = fVar147 + auVar78._4_4_;
      auVar101._8_4_ = fVar149 + auVar78._8_4_;
      auVar101._12_4_ = fVar151 + auVar78._12_4_;
      auVar101._16_4_ = fVar153 + auVar78._16_4_;
      auVar101._20_4_ = fVar155 + auVar78._20_4_;
      auVar101._24_4_ = fVar157 + auVar78._24_4_;
      auVar101._28_4_ = local_13a0._28_4_ + auVar78._28_4_;
      fVar2 = local_11a0._0_4_;
      fVar3 = local_11a0._4_4_;
      auVar38._4_4_ = auVar92._4_4_ * fVar3;
      auVar38._0_4_ = auVar92._0_4_ * fVar2;
      fVar16 = local_11a0._8_4_;
      auVar38._8_4_ = auVar92._8_4_ * fVar16;
      fVar18 = local_11a0._12_4_;
      auVar38._12_4_ = auVar92._12_4_ * fVar18;
      fVar20 = local_11a0._16_4_;
      auVar38._16_4_ = auVar92._16_4_ * fVar20;
      fVar22 = local_11a0._20_4_;
      auVar38._20_4_ = auVar92._20_4_ * fVar22;
      fVar24 = local_11a0._24_4_;
      auVar38._24_4_ = auVar92._24_4_ * fVar24;
      auVar38._28_4_ = fVar1;
      auVar91 = vfmsub231ps_fma(auVar38,local_1180,auVar101);
      auVar116 = vsubps_avx(auVar110,auVar85);
      fVar143 = auVar116._0_4_;
      fVar148 = auVar116._4_4_;
      auVar39._4_4_ = fVar148 * auVar101._4_4_;
      auVar39._0_4_ = fVar143 * auVar101._0_4_;
      fVar150 = auVar116._8_4_;
      auVar39._8_4_ = fVar150 * auVar101._8_4_;
      fVar152 = auVar116._12_4_;
      auVar39._12_4_ = fVar152 * auVar101._12_4_;
      fVar154 = auVar116._16_4_;
      auVar39._16_4_ = fVar154 * auVar101._16_4_;
      fVar156 = auVar116._20_4_;
      auVar39._20_4_ = fVar156 * auVar101._20_4_;
      fVar158 = auVar116._24_4_;
      auVar39._24_4_ = fVar158 * auVar101._24_4_;
      auVar39._28_4_ = auVar101._28_4_;
      auVar125._0_4_ = auVar110._0_4_ + auVar85._0_4_;
      auVar125._4_4_ = auVar110._4_4_ + auVar85._4_4_;
      auVar125._8_4_ = auVar110._8_4_ + auVar85._8_4_;
      auVar125._12_4_ = auVar110._12_4_ + auVar85._12_4_;
      auVar125._16_4_ = auVar110._16_4_ + auVar85._16_4_;
      auVar125._20_4_ = auVar110._20_4_ + auVar85._20_4_;
      auVar125._24_4_ = auVar110._24_4_ + auVar85._24_4_;
      auVar125._28_4_ = auVar110._28_4_ + auVar85._28_4_;
      auVar84 = vfmsub231ps_fma(auVar39,local_11a0,auVar125);
      fVar1 = local_1180._0_4_;
      fVar15 = local_1180._4_4_;
      auVar40._4_4_ = auVar125._4_4_ * fVar15;
      auVar40._0_4_ = auVar125._0_4_ * fVar1;
      fVar17 = local_1180._8_4_;
      auVar40._8_4_ = auVar125._8_4_ * fVar17;
      fVar19 = local_1180._12_4_;
      auVar40._12_4_ = auVar125._12_4_ * fVar19;
      fVar21 = local_1180._16_4_;
      auVar40._16_4_ = auVar125._16_4_ * fVar21;
      fVar23 = local_1180._20_4_;
      auVar40._20_4_ = auVar125._20_4_ * fVar23;
      fVar25 = local_1180._24_4_;
      auVar40._24_4_ = auVar125._24_4_ * fVar25;
      auVar40._28_4_ = auVar125._28_4_;
      auVar83 = vfmsub231ps_fma(auVar40,auVar116,auVar92);
      auVar41._4_4_ = auVar83._4_4_ * local_1120;
      auVar41._0_4_ = auVar83._0_4_ * local_1120;
      auVar41._8_4_ = auVar83._8_4_ * local_1120;
      auVar41._12_4_ = auVar83._12_4_ * local_1120;
      auVar41._16_4_ = local_1120 * 0.0;
      auVar41._20_4_ = local_1120 * 0.0;
      auVar41._24_4_ = local_1120 * 0.0;
      auVar41._28_4_ = local_11a0._28_4_;
      auVar84 = vfmadd231ps_fma(auVar41,local_1160,ZEXT1632(auVar84));
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar74,ZEXT1632(auVar91));
      auVar138 = vsubps_avx(auVar85,auVar108);
      auVar95._0_4_ = auVar85._0_4_ + auVar108._0_4_;
      auVar95._4_4_ = auVar85._4_4_ + auVar108._4_4_;
      auVar95._8_4_ = auVar85._8_4_ + auVar108._8_4_;
      auVar95._12_4_ = auVar85._12_4_ + auVar108._12_4_;
      auVar95._16_4_ = auVar85._16_4_ + auVar108._16_4_;
      auVar95._20_4_ = auVar85._20_4_ + auVar108._20_4_;
      auVar95._24_4_ = auVar85._24_4_ + auVar108._24_4_;
      auVar95._28_4_ = auVar85._28_4_ + auVar108._28_4_;
      auVar108 = vsubps_avx(auVar71,auVar72);
      auVar75._0_4_ = auVar71._0_4_ + auVar72._0_4_;
      auVar75._4_4_ = auVar71._4_4_ + auVar72._4_4_;
      auVar75._8_4_ = auVar71._8_4_ + auVar72._8_4_;
      auVar75._12_4_ = auVar71._12_4_ + auVar72._12_4_;
      auVar75._16_4_ = auVar71._16_4_ + auVar72._16_4_;
      auVar75._20_4_ = auVar71._20_4_ + auVar72._20_4_;
      auVar75._24_4_ = auVar71._24_4_ + auVar72._24_4_;
      auVar75._28_4_ = auVar71._28_4_ + fVar111;
      auVar72 = vsubps_avx(auVar78,auVar104);
      auVar93._0_4_ = auVar78._0_4_ + auVar104._0_4_;
      auVar93._4_4_ = auVar78._4_4_ + auVar104._4_4_;
      auVar93._8_4_ = auVar78._8_4_ + auVar104._8_4_;
      auVar93._12_4_ = auVar78._12_4_ + auVar104._12_4_;
      auVar93._16_4_ = auVar78._16_4_ + auVar104._16_4_;
      auVar93._20_4_ = auVar78._20_4_ + auVar104._20_4_;
      auVar93._24_4_ = auVar78._24_4_ + auVar104._24_4_;
      auVar93._28_4_ = auVar78._28_4_ + auVar104._28_4_;
      auVar42._4_4_ = auVar72._4_4_ * auVar75._4_4_;
      auVar42._0_4_ = auVar72._0_4_ * auVar75._0_4_;
      auVar42._8_4_ = auVar72._8_4_ * auVar75._8_4_;
      auVar42._12_4_ = auVar72._12_4_ * auVar75._12_4_;
      auVar42._16_4_ = auVar72._16_4_ * auVar75._16_4_;
      auVar42._20_4_ = auVar72._20_4_ * auVar75._20_4_;
      auVar42._24_4_ = auVar72._24_4_ * auVar75._24_4_;
      auVar42._28_4_ = fVar111;
      auVar83 = vfmsub231ps_fma(auVar42,auVar108,auVar93);
      auVar43._4_4_ = auVar93._4_4_ * auVar138._4_4_;
      auVar43._0_4_ = auVar93._0_4_ * auVar138._0_4_;
      auVar43._8_4_ = auVar93._8_4_ * auVar138._8_4_;
      auVar43._12_4_ = auVar93._12_4_ * auVar138._12_4_;
      auVar43._16_4_ = auVar93._16_4_ * auVar138._16_4_;
      auVar43._20_4_ = auVar93._20_4_ * auVar138._20_4_;
      auVar43._24_4_ = auVar93._24_4_ * auVar138._24_4_;
      auVar43._28_4_ = auVar93._28_4_;
      auVar91 = vfmsub231ps_fma(auVar43,auVar72,auVar95);
      auVar44._4_4_ = auVar95._4_4_ * auVar108._4_4_;
      auVar44._0_4_ = auVar95._0_4_ * auVar108._0_4_;
      auVar44._8_4_ = auVar95._8_4_ * auVar108._8_4_;
      auVar44._12_4_ = auVar95._12_4_ * auVar108._12_4_;
      auVar44._16_4_ = auVar95._16_4_ * auVar108._16_4_;
      auVar44._20_4_ = auVar95._20_4_ * auVar108._20_4_;
      auVar44._24_4_ = auVar95._24_4_ * auVar108._24_4_;
      auVar44._28_4_ = auVar95._28_4_;
      auVar94 = vfmsub231ps_fma(auVar44,auVar138,auVar75);
      fStack_111c = local_1120;
      fStack_1118 = local_1120;
      fStack_1114 = local_1120;
      fStack_1110 = local_1120;
      fStack_110c = local_1120;
      fStack_1108 = local_1120;
      fStack_1104 = local_1120;
      auVar96._0_4_ = local_1120 * auVar94._0_4_;
      auVar96._4_4_ = local_1120 * auVar94._4_4_;
      auVar96._8_4_ = local_1120 * auVar94._8_4_;
      auVar96._12_4_ = local_1120 * auVar94._12_4_;
      auVar96._16_4_ = local_1120 * 0.0;
      auVar96._20_4_ = local_1120 * 0.0;
      auVar96._24_4_ = local_1120 * 0.0;
      auVar96._28_4_ = 0;
      auVar91 = vfmadd231ps_fma(auVar96,local_1160,ZEXT1632(auVar91));
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar74,ZEXT1632(auVar83));
      auVar103._0_8_ =
           CONCAT44(auVar91._4_4_ + local_1340._4_4_ + auVar84._4_4_,
                    auVar91._0_4_ + local_1340._0_4_ + auVar84._0_4_);
      auVar103._8_4_ = auVar91._8_4_ + local_1340._8_4_ + auVar84._8_4_;
      auVar103._12_4_ = auVar91._12_4_ + local_1340._12_4_ + auVar84._12_4_;
      auVar104 = ZEXT1632(auVar103);
      auVar85 = vminps_avx(ZEXT1632(local_1340),ZEXT1632(auVar84));
      auVar85 = vminps_avx(auVar85,ZEXT1632(auVar91));
      auVar76._8_4_ = 0x7fffffff;
      auVar76._0_8_ = 0x7fffffff7fffffff;
      auVar76._12_4_ = 0x7fffffff;
      auVar76._16_4_ = 0x7fffffff;
      auVar76._20_4_ = 0x7fffffff;
      auVar76._24_4_ = 0x7fffffff;
      auVar76._28_4_ = 0x7fffffff;
      local_11c0 = vandps_avx(auVar104,auVar76);
      fVar111 = local_11c0._0_4_ * 1.1920929e-07;
      fVar118 = local_11c0._4_4_ * 1.1920929e-07;
      auVar45._4_4_ = fVar118;
      auVar45._0_4_ = fVar111;
      fVar119 = local_11c0._8_4_ * 1.1920929e-07;
      auVar45._8_4_ = fVar119;
      fVar120 = local_11c0._12_4_ * 1.1920929e-07;
      auVar45._12_4_ = fVar120;
      fVar121 = local_11c0._16_4_ * 1.1920929e-07;
      auVar45._16_4_ = fVar121;
      fVar122 = local_11c0._20_4_ * 1.1920929e-07;
      auVar45._20_4_ = fVar122;
      fVar123 = local_11c0._24_4_ * 1.1920929e-07;
      auVar45._24_4_ = fVar123;
      auVar45._28_4_ = local_11c0._28_4_;
      auVar126._0_8_ = CONCAT44(fVar118,fVar111) ^ 0x8000000080000000;
      auVar126._8_4_ = -fVar119;
      auVar126._12_4_ = -fVar120;
      auVar126._16_4_ = -fVar121;
      auVar126._20_4_ = -fVar122;
      auVar126._24_4_ = -fVar123;
      auVar126._28_4_ = local_11c0._28_4_ ^ 0x80000000;
      auVar85 = vcmpps_avx(auVar85,auVar126,5);
      auVar78 = vmaxps_avx(ZEXT1632(local_1340),ZEXT1632(auVar84));
      auVar71 = vmaxps_avx(auVar78,ZEXT1632(auVar91));
      auVar71 = vcmpps_avx(auVar71,auVar45,2);
      auVar85 = vorps_avx(auVar85,auVar71);
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0x7f,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0xbf,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar85[0x1f] < '\0') {
        auVar46._4_4_ = fVar15 * local_1100._4_4_;
        auVar46._0_4_ = fVar1 * local_1100._0_4_;
        auVar46._8_4_ = fVar17 * local_1100._8_4_;
        auVar46._12_4_ = fVar19 * local_1100._12_4_;
        auVar46._16_4_ = fVar21 * local_1100._16_4_;
        auVar46._20_4_ = fVar23 * local_1100._20_4_;
        auVar46._24_4_ = fVar25 * local_1100._24_4_;
        auVar46._28_4_ = auVar71._28_4_;
        auVar115._0_4_ = fVar143 * local_1140._0_4_;
        auVar115._4_4_ = fVar148 * local_1140._4_4_;
        auVar115._8_4_ = fVar150 * local_1140._8_4_;
        auVar115._12_4_ = fVar152 * local_1140._12_4_;
        auVar115._16_4_ = fVar154 * local_1140._16_4_;
        auVar115._20_4_ = fVar156 * local_1140._20_4_;
        auVar115._24_4_ = fVar158 * local_1140._24_4_;
        auVar115._28_4_ = 0;
        auVar91 = vfmsub213ps_fma(local_1140,local_11a0,auVar46);
        auVar47._4_4_ = fVar3 * auVar108._4_4_;
        auVar47._0_4_ = fVar2 * auVar108._0_4_;
        auVar47._8_4_ = fVar16 * auVar108._8_4_;
        auVar47._12_4_ = fVar18 * auVar108._12_4_;
        auVar47._16_4_ = fVar20 * auVar108._16_4_;
        auVar47._20_4_ = fVar22 * auVar108._20_4_;
        auVar47._24_4_ = fVar24 * auVar108._24_4_;
        auVar47._28_4_ = auVar78._28_4_;
        auVar48._4_4_ = fVar148 * auVar72._4_4_;
        auVar48._0_4_ = fVar143 * auVar72._0_4_;
        auVar48._8_4_ = fVar150 * auVar72._8_4_;
        auVar48._12_4_ = fVar152 * auVar72._12_4_;
        auVar48._16_4_ = fVar154 * auVar72._16_4_;
        auVar48._20_4_ = fVar156 * auVar72._20_4_;
        auVar48._24_4_ = fVar158 * auVar72._24_4_;
        auVar48._28_4_ = 0x34000000;
        auVar83 = vfmsub213ps_fma(auVar72,local_1180,auVar47);
        auVar71 = vandps_avx(auVar46,auVar76);
        auVar78 = vandps_avx(auVar47,auVar76);
        auVar71 = vcmpps_avx(auVar71,auVar78,1);
        local_1240 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar91),auVar71);
        auVar49._4_4_ = fVar15 * auVar138._4_4_;
        auVar49._0_4_ = fVar1 * auVar138._0_4_;
        auVar49._8_4_ = fVar17 * auVar138._8_4_;
        auVar49._12_4_ = fVar19 * auVar138._12_4_;
        auVar49._16_4_ = fVar21 * auVar138._16_4_;
        auVar49._20_4_ = fVar23 * auVar138._20_4_;
        auVar49._24_4_ = fVar25 * auVar138._24_4_;
        auVar49._28_4_ = auVar71._28_4_;
        auVar91 = vfmsub213ps_fma(auVar138,local_11a0,auVar48);
        auVar50._4_4_ = local_10e0._4_4_ * fVar3;
        auVar50._0_4_ = local_10e0._0_4_ * fVar2;
        auVar50._8_4_ = local_10e0._8_4_ * fVar16;
        auVar50._12_4_ = local_10e0._12_4_ * fVar18;
        auVar50._16_4_ = local_10e0._16_4_ * fVar20;
        auVar50._20_4_ = local_10e0._20_4_ * fVar22;
        auVar50._24_4_ = local_10e0._24_4_ * fVar24;
        auVar50._28_4_ = auVar78._28_4_;
        auVar83 = vfmsub213ps_fma(local_1100,auVar116,auVar50);
        auVar71 = vandps_avx(auVar50,auVar76);
        auVar78 = vandps_avx(auVar48,auVar76);
        auVar71 = vcmpps_avx(auVar71,auVar78,1);
        local_1220 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar83),auVar71);
        auVar91 = vfmsub213ps_fma(local_10e0,local_1180,auVar115);
        auVar83 = vfmsub213ps_fma(auVar108,auVar116,auVar49);
        auVar71 = vandps_avx(auVar115,auVar76);
        auVar78 = vandps_avx(auVar49,auVar76);
        auVar71 = vcmpps_avx(auVar71,auVar78,1);
        local_1200 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar91),auVar71);
        auVar91 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        auVar77._0_4_ = local_1200._0_4_ * local_1120;
        auVar77._4_4_ = local_1200._4_4_ * local_1120;
        auVar77._8_4_ = local_1200._8_4_ * local_1120;
        auVar77._12_4_ = local_1200._12_4_ * local_1120;
        auVar77._16_4_ = local_1200._16_4_ * local_1120;
        auVar77._20_4_ = local_1200._20_4_ * local_1120;
        auVar77._24_4_ = local_1200._24_4_ * local_1120;
        auVar77._28_4_ = 0;
        auVar83 = vfmadd213ps_fma(local_1160,local_1220,auVar77);
        auVar83 = vfmadd213ps_fma(auVar74,local_1240,ZEXT1632(auVar83));
        auVar78 = ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                     CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                              CONCAT44(auVar83._4_4_ + auVar83._4_4_,
                                                       auVar83._0_4_ + auVar83._0_4_))));
        auVar97._0_4_ = local_1200._0_4_ * fVar142;
        auVar97._4_4_ = local_1200._4_4_ * fVar147;
        auVar97._8_4_ = local_1200._8_4_ * fVar149;
        auVar97._12_4_ = local_1200._12_4_ * fVar151;
        auVar97._16_4_ = local_1200._16_4_ * fVar153;
        auVar97._20_4_ = local_1200._20_4_ * fVar155;
        auVar97._24_4_ = local_1200._24_4_ * fVar157;
        auVar97._28_4_ = 0;
        auVar83 = vfmadd213ps_fma(auVar86,local_1220,auVar97);
        auVar94 = vfmadd213ps_fma(auVar110,local_1240,ZEXT1632(auVar83));
        auVar85 = vrcpps_avx(auVar78);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar127._16_4_ = 0x3f800000;
        auVar127._20_4_ = 0x3f800000;
        auVar127._24_4_ = 0x3f800000;
        auVar127._28_4_ = 0x3f800000;
        auVar83 = vfnmadd213ps_fma(auVar85,auVar78,auVar127);
        auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar85,auVar85);
        auVar51._28_4_ = 0x3f800000;
        auVar51._0_28_ =
             ZEXT1628(CONCAT412((auVar94._12_4_ + auVar94._12_4_) * auVar83._12_4_,
                                CONCAT48((auVar94._8_4_ + auVar94._8_4_) * auVar83._8_4_,
                                         CONCAT44((auVar94._4_4_ + auVar94._4_4_) * auVar83._4_4_,
                                                  (auVar94._0_4_ + auVar94._0_4_) * auVar83._0_4_)))
                     );
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar98._4_4_ = uVar4;
        auVar98._0_4_ = uVar4;
        auVar98._8_4_ = uVar4;
        auVar98._12_4_ = uVar4;
        auVar98._16_4_ = uVar4;
        auVar98._20_4_ = uVar4;
        auVar98._24_4_ = uVar4;
        auVar98._28_4_ = uVar4;
        auVar85 = vcmpps_avx(auVar98,auVar51,2);
        auVar105._4_4_ = uVar112;
        auVar105._0_4_ = uVar112;
        auVar105._8_4_ = uVar112;
        auVar105._12_4_ = uVar112;
        auVar105._16_4_ = uVar112;
        auVar105._20_4_ = uVar112;
        auVar105._24_4_ = uVar112;
        auVar105._28_4_ = uVar112;
        auVar71 = vcmpps_avx(auVar51,auVar105,2);
        auVar85 = vandps_avx(auVar85,auVar71);
        auVar83 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        auVar91 = vpand_avx(auVar83,auVar91);
        auVar85 = vpmovsxwd_avx2(auVar91);
        if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0x7f,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0xbf,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar85[0x1f] < '\0') {
          auVar85 = vcmpps_avx(auVar78,_DAT_01f7b000,4);
          auVar83 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          auVar91 = vpand_avx(auVar91,auVar83);
          local_12c0 = vpmovsxwd_avx2(auVar91);
          if ((((((((local_12c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_12c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_12c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_12c0 >> 0x7f,0) != '\0') ||
                (local_12c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_12c0 >> 0xbf,0) != '\0') ||
              (local_12c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_12c0[0x1f] < '\0') {
            uStack_1458._0_4_ = *(float *)(local_13d8 + 0x18);
            local_1420._4_4_ = *(float *)(local_13d8 + 0x1c);
            uStack_1330 = 0;
            uStack_1328 = 0;
            local_1320 = ZEXT1632(auVar84);
            uStack_1498 = auVar103._8_8_;
            local_1300 = auVar103._0_8_;
            uStack_12f8 = uStack_1498;
            uStack_12f0 = 0;
            uStack_12e8 = 0;
            local_12e0 = &local_1438;
            local_1260 = auVar51;
            pGVar65 = (context->scene->geometries).items[(uint)(float)uStack_1458].ptr;
            if ((pGVar65->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar91 = *(undefined1 (*) [16])(local_1438 + local_1430 * 4);
              auVar83 = auVar91;
              if (2 < local_1428) {
                auVar83 = *(undefined1 (*) [16])(local_1438 + local_1430 * 8);
              }
              auVar85 = vrcpps_avx(auVar104);
              auVar109._8_4_ = 0x3f800000;
              auVar109._0_8_ = 0x3f8000003f800000;
              auVar109._12_4_ = 0x3f800000;
              auVar109._16_4_ = 0x3f800000;
              auVar109._20_4_ = 0x3f800000;
              auVar109._24_4_ = 0x3f800000;
              auVar109._28_4_ = 0x3f800000;
              auVar94 = vfnmadd213ps_fma(auVar104,auVar85,auVar109);
              auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar85,auVar85);
              auVar79._8_4_ = 0x219392ef;
              auVar79._0_8_ = 0x219392ef219392ef;
              auVar79._12_4_ = 0x219392ef;
              auVar79._16_4_ = 0x219392ef;
              auVar79._20_4_ = 0x219392ef;
              auVar79._24_4_ = 0x219392ef;
              auVar79._28_4_ = 0x219392ef;
              auVar71 = vcmpps_avx(local_11c0,auVar79,5);
              auVar85 = vandps_avx(auVar71,ZEXT1632(auVar94));
              auVar52._4_4_ = auVar85._4_4_ * local_1340._4_4_;
              auVar52._0_4_ = auVar85._0_4_ * local_1340._0_4_;
              auVar52._8_4_ = auVar85._8_4_ * local_1340._8_4_;
              auVar52._12_4_ = auVar85._12_4_ * local_1340._12_4_;
              auVar52._16_4_ = auVar85._16_4_ * 0.0;
              auVar52._20_4_ = auVar85._20_4_ * 0.0;
              auVar52._24_4_ = auVar85._24_4_ * 0.0;
              auVar52._28_4_ = auVar71._28_4_;
              auVar71 = vminps_avx(auVar52,auVar109);
              auVar88._0_4_ = auVar85._0_4_ * auVar84._0_4_;
              auVar88._4_4_ = auVar85._4_4_ * auVar84._4_4_;
              auVar88._8_4_ = auVar85._8_4_ * auVar84._8_4_;
              auVar88._12_4_ = auVar85._12_4_ * auVar84._12_4_;
              auVar88._16_4_ = auVar85._16_4_ * 0.0;
              auVar88._20_4_ = auVar85._20_4_ * 0.0;
              auVar88._24_4_ = auVar85._24_4_ * 0.0;
              auVar88._28_4_ = 0;
              auVar85 = vminps_avx(auVar88,auVar109);
              auVar84 = *(undefined1 (*) [16])local_1438;
              if (local_1430 == 2) {
                auVar84 = vpshufd_avx(auVar84,0x54);
                auVar91 = vpshufd_avx(auVar91,0x54);
                auVar83 = vpshufd_avx(auVar83,0x54);
              }
              auVar106._0_16_ = ZEXT116(0) * auVar91 + ZEXT116(1) * auVar84;
              auVar106._16_16_ = ZEXT116(1) * auVar91;
              auVar99._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar91;
              auVar99._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar83
              ;
              auVar78 = vpunpckldq_avx2(auVar106,auVar99);
              auVar108 = vpshufd_avx2(auVar106,0xa5);
              auVar104 = vpshufd_avx2(auVar99,0x94);
              auVar110 = vpsrld_avx2(auVar78,0x10);
              auVar72 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar78 = vpblendw_avx2(auVar78,auVar72,0xaa);
              auVar78 = vcvtdq2ps_avx(auVar78);
              auVar110 = vcvtdq2ps_avx(auVar110);
              auVar116 = vpsrld_avx2(auVar108,0x10);
              auVar108 = vpblendw_avx2(auVar108,auVar72,0xaa);
              auVar108 = vcvtdq2ps_avx(auVar108);
              auVar72 = vcvtdq2ps_avx(auVar116);
              auVar116 = vpsrld_avx2(auVar104,0x10);
              auVar104 = vpblendw_avx2(auVar104,ZEXT1232(ZEXT412(0)) << 0x20,0xaa);
              auVar104 = vcvtdq2ps_avx(auVar104);
              auVar116 = vcvtdq2ps_avx(auVar116);
              auVar107._0_4_ =
                   auVar116._0_4_ * 0.00012207031 * auVar85._0_4_ +
                   auVar71._0_4_ * auVar72._0_4_ * 0.00012207031;
              auVar107._4_4_ =
                   auVar116._4_4_ * 0.00012207031 * auVar85._4_4_ +
                   auVar71._4_4_ * auVar72._4_4_ * 0.00012207031;
              auVar107._8_4_ =
                   auVar116._8_4_ * 0.00012207031 * auVar85._8_4_ +
                   auVar71._8_4_ * auVar72._8_4_ * 0.00012207031;
              auVar107._12_4_ =
                   auVar116._12_4_ * 0.00012207031 * auVar85._12_4_ +
                   auVar71._12_4_ * auVar72._12_4_ * 0.00012207031;
              auVar107._16_4_ =
                   auVar116._16_4_ * 0.00012207031 * auVar85._16_4_ +
                   auVar71._16_4_ * auVar72._16_4_ * 0.00012207031;
              auVar107._20_4_ =
                   auVar116._20_4_ * 0.00012207031 * auVar85._20_4_ +
                   auVar71._20_4_ * auVar72._20_4_ * 0.00012207031;
              auVar107._24_4_ =
                   auVar116._24_4_ * 0.00012207031 * auVar85._24_4_ +
                   auVar71._24_4_ * auVar72._24_4_ * 0.00012207031;
              auVar107._28_4_ = auVar108._28_4_ + auVar72._28_4_;
              auVar117._8_4_ = 0x3f800000;
              auVar117._0_8_ = 0x3f8000003f800000;
              auVar117._12_4_ = 0x3f800000;
              auVar117._16_4_ = 0x3f800000;
              auVar117._20_4_ = 0x3f800000;
              auVar117._24_4_ = 0x3f800000;
              auVar117._28_4_ = 0x3f800000;
              auVar72 = vsubps_avx(auVar117,auVar71);
              auVar72 = vsubps_avx(auVar72,auVar85);
              local_12a0[0] =
                   auVar85._0_4_ * auVar104._0_4_ * 0.00012207031 +
                   auVar71._0_4_ * auVar108._0_4_ * 0.00012207031 +
                   auVar72._0_4_ * auVar78._0_4_ * 0.00012207031;
              local_12a0[1] =
                   auVar85._4_4_ * auVar104._4_4_ * 0.00012207031 +
                   auVar71._4_4_ * auVar108._4_4_ * 0.00012207031 +
                   auVar72._4_4_ * auVar78._4_4_ * 0.00012207031;
              local_12a0[2] =
                   auVar85._8_4_ * auVar104._8_4_ * 0.00012207031 +
                   auVar71._8_4_ * auVar108._8_4_ * 0.00012207031 +
                   auVar72._8_4_ * auVar78._8_4_ * 0.00012207031;
              local_12a0[3] =
                   auVar85._12_4_ * auVar104._12_4_ * 0.00012207031 +
                   auVar71._12_4_ * auVar108._12_4_ * 0.00012207031 +
                   auVar72._12_4_ * auVar78._12_4_ * 0.00012207031;
              fStack_1290 = auVar85._16_4_ * auVar104._16_4_ * 0.00012207031 +
                            auVar71._16_4_ * auVar108._16_4_ * 0.00012207031 +
                            auVar72._16_4_ * auVar78._16_4_ * 0.00012207031;
              fStack_128c = auVar85._20_4_ * auVar104._20_4_ * 0.00012207031 +
                            auVar71._20_4_ * auVar108._20_4_ * 0.00012207031 +
                            auVar72._20_4_ * auVar78._20_4_ * 0.00012207031;
              fStack_1288 = auVar85._24_4_ * auVar104._24_4_ * 0.00012207031 +
                            auVar71._24_4_ * auVar108._24_4_ * 0.00012207031 +
                            auVar72._24_4_ * auVar78._24_4_ * 0.00012207031;
              fStack_1284 = auVar104._28_4_ + auVar108._28_4_ + auVar85._28_4_;
              local_1280[0] = auVar107._0_4_ + auVar72._0_4_ * auVar110._0_4_ * 0.00012207031;
              local_1280[1] = auVar107._4_4_ + auVar72._4_4_ * auVar110._4_4_ * 0.00012207031;
              local_1280[2] = auVar107._8_4_ + auVar72._8_4_ * auVar110._8_4_ * 0.00012207031;
              local_1280[3] = auVar107._12_4_ + auVar72._12_4_ * auVar110._12_4_ * 0.00012207031;
              fStack_1270 = auVar107._16_4_ + auVar72._16_4_ * auVar110._16_4_ * 0.00012207031;
              fStack_126c = auVar107._20_4_ + auVar72._20_4_ * auVar110._20_4_ * 0.00012207031;
              fStack_1268 = auVar107._24_4_ + auVar72._24_4_ * auVar110._24_4_ * 0.00012207031;
              fStack_1264 = auVar107._28_4_ + auVar72._28_4_;
              auVar80._8_4_ = 0x7f800000;
              auVar80._0_8_ = 0x7f8000007f800000;
              auVar80._12_4_ = 0x7f800000;
              auVar80._16_4_ = 0x7f800000;
              auVar80._20_4_ = 0x7f800000;
              auVar80._24_4_ = 0x7f800000;
              auVar80._28_4_ = 0x7f800000;
              auVar85 = vblendvps_avx(auVar80,auVar51,local_12c0);
              auVar71 = vshufps_avx(auVar85,auVar85,0xb1);
              auVar71 = vminps_avx(auVar85,auVar71);
              auVar78 = vshufpd_avx(auVar71,auVar71,5);
              auVar71 = vminps_avx(auVar71,auVar78);
              auVar78 = vpermpd_avx2(auVar71,0x4e);
              auVar71 = vminps_avx(auVar71,auVar78);
              auVar71 = vcmpps_avx(auVar85,auVar71,0);
              auVar78 = local_12c0 & auVar71;
              auVar85 = local_12c0;
              if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar78 >> 0x7f,0) != '\0') ||
                    (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar78 >> 0xbf,0) != '\0') ||
                  (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar78[0x1f] < '\0') {
                auVar85 = vandps_avx(auVar71,local_12c0);
              }
              auVar71 = vpcmpeqd_avx2(auVar107,auVar107);
              auVar82 = ZEXT3264(auVar71);
              uVar61 = vmovmskps_avx(auVar85);
              uVar59 = 0;
              for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
                uVar59 = uVar59 + 1;
              }
              uVar64 = (ulong)uVar59;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar1 = local_12a0[uVar64];
                fVar2 = local_1280[uVar64];
                uVar4 = *(undefined4 *)(local_1240 + uVar64 * 4);
                uVar5 = *(undefined4 *)(local_1220 + uVar64 * 4);
                uVar6 = *(undefined4 *)(local_1200 + uVar64 * 4);
                uVar112 = *(undefined4 *)(local_1260 + uVar64 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar6;
                *(float *)(ray + k * 4 + 0x1e0) = fVar1;
                *(float *)(ray + k * 4 + 0x200) = fVar2;
                *(float *)(ray + k * 4 + 0x220) = local_1420._4_4_;
                *(float *)(ray + k * 4 + 0x240) = (float)uStack_1458;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_1460 = CONCAT44((float)uStack_1458,(float)uStack_1458);
                uStack_1458._4_4_ = (float)uStack_1458;
                uStack_1450._0_4_ = (float)uStack_1458;
                uStack_1450._4_4_ = (float)uStack_1458;
                auVar56 = _local_1460;
                uStack_1448._0_4_ = (float)uStack_1458;
                uStack_1448._4_4_ = (float)uStack_1458;
                auVar85 = _local_1460;
                local_1420._0_4_ = local_1420._4_4_;
                uStack_1418._0_4_ = local_1420._4_4_;
                uStack_1418._4_4_ = local_1420._4_4_;
                uStack_1410._0_4_ = local_1420._4_4_;
                uStack_1410._4_4_ = local_1420._4_4_;
                uStack_1408._0_4_ = local_1420._4_4_;
                uStack_1408._4_4_ = local_1420._4_4_;
                auStack_13f8 = auVar86._8_24_;
                local_1400 = pGVar65;
                local_1380 = local_12c0;
                while( true ) {
                  local_1060 = local_12a0[uVar64];
                  local_1040 = local_1280[uVar64];
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1260 + uVar64 * 4);
                  local_10c0 = *(undefined4 *)(local_1240 + uVar64 * 4);
                  uVar4 = *(undefined4 *)(local_1220 + uVar64 * 4);
                  local_10a0._4_4_ = uVar4;
                  local_10a0._0_4_ = uVar4;
                  local_10a0._8_4_ = uVar4;
                  local_10a0._12_4_ = uVar4;
                  local_10a0._16_4_ = uVar4;
                  local_10a0._20_4_ = uVar4;
                  local_10a0._24_4_ = uVar4;
                  local_10a0._28_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_1200 + uVar64 * 4);
                  local_1080._4_4_ = uVar4;
                  local_1080._0_4_ = uVar4;
                  local_1080._8_4_ = uVar4;
                  local_1080._12_4_ = uVar4;
                  local_1080._16_4_ = uVar4;
                  local_1080._20_4_ = uVar4;
                  local_1080._24_4_ = uVar4;
                  local_1080._28_4_ = uVar4;
                  local_13d0.context = context->user;
                  uStack_10bc = local_10c0;
                  uStack_10b8 = local_10c0;
                  uStack_10b4 = local_10c0;
                  uStack_10b0 = local_10c0;
                  uStack_10ac = local_10c0;
                  uStack_10a8 = local_10c0;
                  uStack_10a4 = local_10c0;
                  fStack_105c = local_1060;
                  fStack_1058 = local_1060;
                  fStack_1054 = local_1060;
                  fStack_1050 = local_1060;
                  fStack_104c = local_1060;
                  fStack_1048 = local_1060;
                  fStack_1044 = local_1060;
                  fStack_103c = local_1040;
                  fStack_1038 = local_1040;
                  fStack_1034 = local_1040;
                  fStack_1030 = local_1040;
                  fStack_102c = local_1040;
                  fStack_1028 = local_1040;
                  fStack_1024 = local_1040;
                  local_1020 = local_1420;
                  uStack_1018 = uStack_1418;
                  uStack_1010 = uStack_1410;
                  uStack_1008 = uStack_1408;
                  uStack_1450 = auVar56._16_8_;
                  uStack_1448 = auVar85._24_8_;
                  local_1000 = local_1460;
                  uStack_ff8 = uStack_1458;
                  uStack_ff0 = uStack_1450;
                  uStack_fe8 = uStack_1448;
                  uStack_fdc = (local_13d0.context)->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = (local_13d0.context)->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  local_1360 = local_11e0;
                  local_13d0.valid = (int *)local_1360;
                  local_13d0.geometryUserPtr = pGVar65->userPtr;
                  local_13d0.hit = (RTCHitN *)&local_10c0;
                  local_13d0.N = 8;
                  local_13d0.ray = (RTCRayN *)ray;
                  if (pGVar65->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar71 = ZEXT1632(auVar82._0_16_);
                    (*pGVar65->intersectionFilterN)(&local_13d0);
                    auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
                    auVar82 = ZEXT3264(auVar71);
                    pGVar65 = local_1400;
                  }
                  auVar78 = vpcmpeqd_avx2(local_1360,_DAT_01f7b000);
                  auVar71 = auVar82._0_32_ & ~auVar78;
                  if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar71 >> 0x7f,0) == '\0') &&
                        (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar71 >> 0xbf,0) == '\0') &&
                      (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar71[0x1f]) {
                    auVar78 = auVar78 ^ auVar82._0_32_;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar71 = ZEXT1632(auVar82._0_16_);
                      (*p_Var14)(&local_13d0);
                      auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
                      auVar82 = ZEXT3264(auVar71);
                      pGVar65 = local_1400;
                    }
                    auVar110 = vpcmpeqd_avx2(local_1360,_DAT_01f7b000);
                    auVar78 = auVar110 ^ auVar82._0_32_;
                    auVar71 = auVar82._0_32_ & ~auVar110;
                    if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar71 >> 0x7f,0) != '\0') ||
                          (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar71 >> 0xbf,0) != '\0') ||
                        (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar71[0x1f] < '\0') {
                      auVar89._0_4_ = auVar110._0_4_ ^ auVar82._0_4_;
                      auVar89._4_4_ = auVar110._4_4_ ^ auVar82._4_4_;
                      auVar89._8_4_ = auVar110._8_4_ ^ auVar82._8_4_;
                      auVar89._12_4_ = auVar110._12_4_ ^ auVar82._12_4_;
                      auVar89._16_4_ = auVar110._16_4_ ^ auVar82._16_4_;
                      auVar89._20_4_ = auVar110._20_4_ ^ auVar82._20_4_;
                      auVar89._24_4_ = auVar110._24_4_ ^ auVar82._24_4_;
                      auVar89._28_4_ = auVar110._28_4_ ^ auVar82._28_4_;
                      auVar71 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])local_13d0.hit);
                      *(undefined1 (*) [32])(local_13d0.ray + 0x180) = auVar71;
                      auVar71 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_13d0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_13d0.ray + 0x1a0) = auVar71;
                      auVar71 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_13d0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_13d0.ray + 0x1c0) = auVar71;
                      auVar71 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_13d0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_13d0.ray + 0x1e0) = auVar71;
                      auVar71 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(local_13d0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_13d0.ray + 0x200) = auVar71;
                      auVar71 = vpmaskmovd_avx2(auVar89,*(undefined1 (*) [32])
                                                         (local_13d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_13d0.ray + 0x220) = auVar71;
                      auVar71 = vpmaskmovd_avx2(auVar89,*(undefined1 (*) [32])
                                                         (local_13d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_13d0.ray + 0x240) = auVar71;
                      auVar71 = vpmaskmovd_avx2(auVar89,*(undefined1 (*) [32])
                                                         (local_13d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_13d0.ray + 0x260) = auVar71;
                      auVar71 = vpmaskmovd_avx2(auVar89,*(undefined1 (*) [32])
                                                         (local_13d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_13d0.ray + 0x280) = auVar71;
                    }
                  }
                  if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar78 >> 0x7f,0) == '\0') &&
                        (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar78 >> 0xbf,0) == '\0') &&
                      (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar78[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                  }
                  else {
                    uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_1380 + uVar64 * 4) = 0;
                  auVar81._4_4_ = uVar112;
                  auVar81._0_4_ = uVar112;
                  auVar81._8_4_ = uVar112;
                  auVar81._12_4_ = uVar112;
                  auVar81._16_4_ = uVar112;
                  auVar81._20_4_ = uVar112;
                  auVar81._24_4_ = uVar112;
                  auVar81._28_4_ = uVar112;
                  auVar78 = vcmpps_avx(auVar51,auVar81,2);
                  auVar71 = vandps_avx(auVar78,local_1380);
                  local_1380 = local_1380 & auVar78;
                  if ((((((((local_1380 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1380 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1380 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1380 >> 0x7f,0) == '\0') &&
                        (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1380 >> 0xbf,0) == '\0') &&
                      (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1380[0x1f]) break;
                  auVar90._8_4_ = 0x7f800000;
                  auVar90._0_8_ = 0x7f8000007f800000;
                  auVar90._12_4_ = 0x7f800000;
                  auVar90._16_4_ = 0x7f800000;
                  auVar90._20_4_ = 0x7f800000;
                  auVar90._24_4_ = 0x7f800000;
                  auVar90._28_4_ = 0x7f800000;
                  auVar78 = vblendvps_avx(auVar90,auVar51,auVar71);
                  auVar110 = vshufps_avx(auVar78,auVar78,0xb1);
                  auVar110 = vminps_avx(auVar78,auVar110);
                  auVar86 = vshufpd_avx(auVar110,auVar110,5);
                  auVar110 = vminps_avx(auVar110,auVar86);
                  auVar86 = vpermpd_avx2(auVar110,0x4e);
                  auVar110 = vminps_avx(auVar110,auVar86);
                  auVar110 = vcmpps_avx(auVar78,auVar110,0);
                  auVar86 = auVar71 & auVar110;
                  auVar78 = auVar71;
                  if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar86 >> 0x7f,0) != '\0') ||
                        (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar86 >> 0xbf,0) != '\0') ||
                      (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar86[0x1f] < '\0') {
                    auVar78 = vandps_avx(auVar110,auVar71);
                  }
                  uVar61 = vmovmskps_avx(auVar78);
                  uVar59 = 0;
                  for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
                    uVar59 = uVar59 + 1;
                  }
                  uVar64 = (ulong)uVar59;
                  local_1380 = auVar71;
                }
              }
            }
          }
        }
      }
      auVar82 = ZEXT1664(CONCAT412(uVar112,CONCAT48(uVar112,CONCAT44(uVar112,uVar112))));
    }
    else {
      lVar31 = *(long *)*(GridSOA **)(uVar64 & 0xfffffffffffffff0);
      (pre->super_Precalculations).grid = *(GridSOA **)(uVar64 & 0xfffffffffffffff0);
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar82 = ZEXT1664(CONCAT412(uVar112,CONCAT48(uVar112,CONCAT44(uVar112,uVar112))));
      if (lVar31 != 0) {
        *(long *)*pauVar70 = lVar31;
        *(undefined4 *)(*pauVar70 + 8) = 0;
        pauVar70 = pauVar70 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }